

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

int __thiscall smf::MidiFile::makeVLV(MidiFile *this,uchar *buffer,int number)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  if ((uint)number < 0x10000000) {
    *buffer = (uchar)((uint)number >> 0x15);
    buffer[1] = (byte)((uint)number >> 0xe) & 0x7f;
    buffer[2] = (byte)((uint)number >> 7) & 0x7f;
    buffer[3] = (byte)number & 0x7f;
    lVar3 = 0;
    uVar4 = 0xffffffff;
    uVar5 = 4;
    bVar1 = false;
    do {
      if (buffer[lVar3] != 0) {
        bVar1 = true;
      }
      if (bVar1) {
        buffer[lVar3] = buffer[lVar3] | 0x80;
      }
      if ((uVar4 == 0xffffffff) && (uVar4 = uVar5, -1 < (char)buffer[lVar3])) {
        uVar4 = 0xffffffff;
      }
      lVar3 = lVar3 + 1;
      uVar5 = uVar5 - 1;
    } while (lVar3 != 3);
    uVar2 = 1;
    if (uVar4 != 0xffffffff) {
      uVar2 = (ulong)uVar4;
    }
    if ((int)uVar2 - 1U < 3) {
      uVar6 = 0;
      do {
        buffer[uVar6] = buffer[(4 - (int)uVar2) + (int)uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar2 != uVar6);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: Meta-message size too large to handle",0x2c);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    uVar2 = 1;
  }
  return (int)uVar2;
}

Assistant:

int MidiFile::makeVLV(uchar *buffer, int number) {

	unsigned long value = (unsigned long)number;

	if (value >= (1 << 28)) {
		std::cerr << "Error: Meta-message size too large to handle" << std::endl;
		buffer[0] = 0;
		buffer[1] = 0;
		buffer[2] = 0;
		buffer[3] = 0;
		return 1;
	}

	buffer[0] = (value >> 21) & 0x7f;
	buffer[1] = (value >> 14) & 0x7f;
	buffer[2] = (value >>  7) & 0x7f;
	buffer[3] = (value >>  0) & 0x7f;

	int i;
	int flag = 0;
	int length = -1;
	for (i=0; i<3; i++) {
		if (buffer[i] != 0) {
			flag = 1;
		}
		if (flag) {
			buffer[i] |= 0x80;
		}
		if (length == -1 && buffer[i] >= 0x80) {
			length = 4-i;
		}
	}

	if (length == -1) {
		length = 1;
	}

	if (length < 4) {
		for (i=0; i<length; i++) {
			buffer[i] = buffer[4-length+i];
		}
	}

	return length;
}